

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.cpp
# Opt level: O0

DEVICE_FEATURE_STATE
Diligent::GetFeatureState
          (DEVICE_FEATURE_STATE RequestedState,DEVICE_FEATURE_STATE SupportedState,char *FeatureName
          )

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  char *FeatureName_local;
  DEVICE_FEATURE_STATE SupportedState_local;
  DEVICE_FEATURE_STATE RequestedState_local;
  
  if (RequestedState == DEVICE_FEATURE_STATE_DISABLED) {
    FeatureName_local._7_1_ = SupportedState == DEVICE_FEATURE_STATE_ENABLED;
  }
  else {
    msg.field_2._8_8_ = FeatureName;
    if (RequestedState == DEVICE_FEATURE_STATE_ENABLED) {
      if (SupportedState != DEVICE_FEATURE_STATE_DISABLED) {
        return DEVICE_FEATURE_STATE_ENABLED;
      }
      LogError<true,char_const*,char[30]>
                (false,"GetFeatureState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
                 ,0x2f,(char **)((long)&msg.field_2 + 8),(char (*) [30])0xc216c7);
    }
    else if (RequestedState != DEVICE_FEATURE_STATE_OPTIONAL) {
      FormatString<char[25]>((string *)local_38,(char (*) [25])"Unexpected feature state");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GetFeatureState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
                 ,0x38);
      std::__cxx11::string::~string((string *)local_38);
      return DEVICE_FEATURE_STATE_DISABLED;
    }
    FeatureName_local._7_1_ = SupportedState != DEVICE_FEATURE_STATE_DISABLED;
  }
  return FeatureName_local._7_1_;
}

Assistant:

static DEVICE_FEATURE_STATE GetFeatureState(DEVICE_FEATURE_STATE RequestedState, DEVICE_FEATURE_STATE SupportedState, const char* FeatureName) noexcept(false)
{
    switch (RequestedState)
    {
        case DEVICE_FEATURE_STATE_DISABLED:
            return SupportedState == DEVICE_FEATURE_STATE_ENABLED ?
                DEVICE_FEATURE_STATE_ENABLED : // the feature is supported by default and can not be disabled
                DEVICE_FEATURE_STATE_DISABLED;

        case DEVICE_FEATURE_STATE_ENABLED:
        {
            if (SupportedState != DEVICE_FEATURE_STATE_DISABLED)
                return DEVICE_FEATURE_STATE_ENABLED;
            else
                LOG_ERROR_AND_THROW(FeatureName, " not supported by this device");
        }

        case DEVICE_FEATURE_STATE_OPTIONAL:
            return SupportedState != DEVICE_FEATURE_STATE_DISABLED ?
                DEVICE_FEATURE_STATE_ENABLED :
                DEVICE_FEATURE_STATE_DISABLED;

        default:
            UNEXPECTED("Unexpected feature state");
            return DEVICE_FEATURE_STATE_DISABLED;
    }
}